

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O1

bool __thiscall
MipsParser::parseVfpuControlRegister(MipsParser *this,Parser *parser,MipsRegisterValue *reg)

{
  void *__s1;
  size_t __n;
  char *__s;
  int iVar1;
  Token *pTVar2;
  size_t sVar3;
  long lVar4;
  size_type __rlen;
  char **ppcVar5;
  allocator<char> local_81;
  ValueType *local_80;
  Parser *local_78;
  string local_70;
  Identifier local_50;
  
  pTVar2 = Tokenizer::peekToken
                     ((parser->entries).
                      super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,0);
  if (pTVar2->type == Integer) {
    if (*(__index_type *)
         ((long)&(pTVar2->value).
                 super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
         + 0x20) != '\x01') {
      __assert_fail("std::holds_alternative<int64_t>(value)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Parser/Tokenizer.h"
                    ,0x59,"int64_t Token::intValue() const");
    }
    lVar4 = *(long *)&(pTVar2->value).
                      super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                      super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      .
                      super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      .
                      super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      .
                      super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      .
                      super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      ._M_u;
    if (lVar4 < 0x10) {
      iVar1 = (int)lVar4;
      reg->num = iVar1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,parseVfpuControlRegister::vfpuCtrlNames[iVar1],&local_81);
      Identifier::Identifier(&local_50,&local_70);
      std::__cxx11::string::operator=((string *)&reg->name,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._name._M_dataplus._M_p != &local_50._name.field_2) {
        operator_delete(local_50._name._M_dataplus._M_p,
                        local_50._name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
LAB_00167f92:
      Tokenizer::eatTokens
                ((parser->entries).
                 super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1].tokenizer,1);
      return true;
    }
  }
  else {
    if (pTVar2->type != Identifier) {
      return false;
    }
    local_78 = parser;
    if (*(__index_type *)
         ((long)&(pTVar2->value).
                 super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
         + 0x20) != '\x04') {
      __assert_fail("std::holds_alternative<Identifier>(value)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Parser/Tokenizer.h"
                    ,0x4d,"const Identifier &Token::identifierValue() const");
    }
    local_80 = &pTVar2->value;
    __s1 = *(void **)&(pTVar2->value).
                      super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                      super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      .
                      super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      .
                      super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      .
                      super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      .
                      super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      ._M_u;
    __n = *(size_t *)
           ((long)&(pTVar2->value).
                   super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                   super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                   .
                   super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                   .super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                   super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                   super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
           + 8);
    ppcVar5 = parseVfpuControlRegister::vfpuCtrlNames;
    lVar4 = 0;
    do {
      __s = *ppcVar5;
      sVar3 = strlen(__s);
      if ((__n == sVar3) && ((__n == 0 || (iVar1 = bcmp(__s1,__s,__n), iVar1 == 0)))) {
        reg->num = (int)lVar4;
        std::__cxx11::string::_M_assign((string *)&reg->name);
        parser = local_78;
        goto LAB_00167f92;
      }
      lVar4 = lVar4 + 1;
      ppcVar5 = ppcVar5 + 1;
    } while (lVar4 != 0x10);
  }
  return false;
}

Assistant:

bool MipsParser::parseVfpuControlRegister(Parser& parser, MipsRegisterValue& reg)
{
	static const char* vfpuCtrlNames[16] = {
		"spfx", "tpfx", "dpfx", "cc",
		"inf4", "rsv5", "rsv6", "rev",
		"rcx0", "rcx1", "rcx2", "rcx3",
		"rcx4", "rcx5", "rcx6", "rcx7",
	};

	const Token& token = parser.peekToken();

	if (token.type == TokenType::Identifier)
	{
		const auto &identifier = token.identifierValue();
		for (int i = 0; i < 16; i++)
		{
			if (identifier == vfpuCtrlNames[i])
			{
				reg.num = i;
				reg.name = identifier;

				parser.eatToken();
				return true;
			}
		}
	} else if (token.type == TokenType::Integer && token.intValue() <= 15)
	{
		reg.num = (int) token.intValue();
		reg.name = Identifier(vfpuCtrlNames[reg.num]);

		parser.eatToken();
		return true;
	}

	return false;
}